

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

void set_add_znode(VecZNode *v,ZNode *z)

{
  uint uVar1;
  undefined4 local_48 [2];
  VecZNode vv;
  uint n;
  uint i;
  ZNode *z_local;
  VecZNode *v_local;
  
  vv.e[2]._0_4_ = v->n;
  local_48[0] = 0;
  vv.n = 0;
  vv.i = 0;
  if ((uint)vv.e[2] < 3) {
    if (v->v == (ZNode **)0x0) {
      v->v = v->e;
      uVar1 = v->n;
      v->n = uVar1 + 1;
      v->e[uVar1] = z;
    }
    else {
      if (v->v == v->e) {
        if (v->n < 3) {
          uVar1 = v->n;
          v->n = uVar1 + 1;
          v->v[uVar1] = z;
          return;
        }
      }
      else if ((v->n & 7) != 0) {
        uVar1 = v->n;
        v->n = uVar1 + 1;
        v->v[uVar1] = z;
        return;
      }
      vec_add_internal(v,z);
    }
  }
  else {
    if ((uint)vv.e[2] == 3) {
      memcpy(local_48,v,0x28);
      v->n = 0;
      v->v = (ZNode **)0x0;
      for (vv.e[2]._4_4_ = 0; vv.e[2]._4_4_ < (uint)vv.e[2]; vv.e[2]._4_4_ = vv.e[2]._4_4_ + 1) {
        set_add_znode_hash(v,*(ZNode **)(vv._0_8_ + (ulong)vv.e[2]._4_4_ * 8));
      }
    }
    set_add_znode_hash(v,z);
  }
  return;
}

Assistant:

static void set_add_znode(VecZNode *v, ZNode *z) {
  uint i, n = v->n;
  VecZNode vv;
  vec_clear(&vv);
  if (n < INTEGRAL_VEC_SIZE) {
    vec_add(v, z);
    return;
  }
  if (n == INTEGRAL_VEC_SIZE) {
    vv = *v;
    vec_clear(v);
    for (i = 0; i < n; i++) set_add_znode_hash(v, vv.v[i]);
  }
  set_add_znode_hash(v, z);
}